

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wrange(OutputFile *this,uint32_t l,uint32_t u)

{
  ostream *o;
  uint32_t u_local;
  uint32_t l_local;
  OutputFile *this_local;
  
  o = stream(this);
  printSpan(o,l,u);
  return this;
}

Assistant:

OutputFile & OutputFile::wrange (uint32_t l, uint32_t u)
{
	printSpan (stream (), l, u);
	return *this;
}